

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall
IlmThread_2_5::anon_unknown_5::NullThreadPoolProvider::addTask(NullThreadPoolProvider *this,Task *t)

{
  (*t->_vptr_Task[2])(t);
  TaskGroup::Data::removeTask(t->_group->_data);
  (*t->_vptr_Task[1])(t);
  return;
}

Assistant:

virtual void addTask (Task *t)
    {
        t->execute ();
        t->group()->_data->removeTask ();
        delete t;
    }